

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void ot::commissioner::Console::Write(string *aLine,Color aColor)

{
  int iVar1;
  ostream *poVar2;
  string colorCode;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::kResetCode_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)
                                 ::kResetCode_abi_cxx11_);
    if (iVar1 != 0) {
      Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::kResetCode_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                     kResetCode_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                  kResetCode_abi_cxx11_,"\x1b[0m","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                    kResetCode_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                           kResetCode_abi_cxx11_);
    }
  }
  local_30 = 0;
  local_28[0] = '\0';
  local_38 = local_28;
  if (aColor < 8) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_38,0,(char *)0x0,
               (ulong)(&DAT_00227060 + *(int *)(&DAT_00227060 + (ulong)aColor * 4)));
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38,local_30);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(aLine->_M_dataplus)._M_p,aLine->_M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                             kResetCode_abi_cxx11_._M_dataplus._M_p,
                      Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                      kResetCode_abi_cxx11_._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void Console::Write(const std::string &aLine, Color aColor)
{
    static const std::string kResetCode = "\u001b[0m";
    std::string              colorCode;

    switch (aColor)
    {
    case Color::kDefault:
        colorCode = "\u001b[0m";
        break;
    case Color::kWhite:
        colorCode = "\u001b[37m";
        break;
    case Color::kRed:
        colorCode = "\u001b[31m";
        break;
    case Color::kGreen:
        colorCode = "\u001b[32m";
        break;
    case Color::kYellow:
        colorCode = "\u001b[33m";
        break;
    case Color::kBlue:
        colorCode = "\u001b[34m";
        break;
    case Color::kMagenta:
        colorCode = "\u001b[35m";
        break;
    case Color::kCyan:
        colorCode = "\u001b[36m";
        break;
    }

    std::cout << colorCode << aLine << kResetCode << std::endl;
}